

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__pic_load_core(stbi__context *s,int width,int height,int *comp,stbi_uc *result)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  uint uVar4;
  stbi_uc *psVar5;
  undefined4 uVar6;
  undefined4 *in_RCX;
  int in_EDX;
  int in_ESI;
  stbi_uc *in_R8;
  stbi_uc value_1 [4];
  int i_1;
  int count_1;
  int left_1;
  stbi_uc value [4];
  stbi_uc count;
  int i;
  int left;
  int x;
  stbi_uc *dest;
  stbi__pic_packet *packet_1;
  int packet_idx;
  stbi__pic_packet *packet;
  stbi__pic_packet packets [10];
  int chained;
  int y;
  int num_packets;
  int act_comp;
  stbi__context *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int local_90;
  stbi_uc local_89 [4];
  byte local_85;
  int local_84;
  int local_80;
  int local_7c;
  stbi_uc *local_78;
  stbi_uc *local_70;
  int local_64;
  stbi_uc *local_60;
  stbi_uc local_58;
  byte abStack_57 [31];
  uint local_38;
  int local_34;
  int local_30;
  uint local_2c;
  stbi_uc *local_28;
  undefined4 *local_20;
  int local_18;
  int local_14;
  
  local_2c = 0;
  local_30 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  do {
    if (local_30 == 10) {
      stbi__err((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      return (stbi_uc *)0x0;
    }
    local_60 = &local_58 + (long)local_30 * 3;
    local_30 = local_30 + 1;
    bVar1 = stbi__get8(in_stack_ffffffffffffff58);
    local_38 = (uint)bVar1;
    sVar2 = stbi__get8(in_stack_ffffffffffffff58);
    *local_60 = sVar2;
    sVar2 = stbi__get8(in_stack_ffffffffffffff58);
    local_60[1] = sVar2;
    sVar2 = stbi__get8(in_stack_ffffffffffffff58);
    local_60[2] = sVar2;
    local_2c = local_60[2] | local_2c;
    iVar3 = stbi__at_eof(in_stack_ffffffffffffff58);
    if (iVar3 != 0) {
      stbi__err((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      return (stbi_uc *)0x0;
    }
    if (*local_60 != '\b') {
      stbi__err((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      return (stbi_uc *)0x0;
    }
  } while (local_38 != 0);
  uVar6 = 3;
  if ((local_2c & 0x10) != 0) {
    uVar6 = 4;
  }
  *local_20 = uVar6;
  local_34 = 0;
  do {
    if (local_18 <= local_34) {
      return local_28;
    }
    for (local_64 = 0; local_64 < local_30; local_64 = local_64 + 1) {
      local_70 = &local_58 + (long)local_64 * 3;
      local_78 = local_28 + local_34 * local_14 * 4;
      uVar4 = (uint)abStack_57[(long)local_64 * 3];
      if (uVar4 == 0) {
        for (local_7c = 0; local_7c < local_14; local_7c = local_7c + 1) {
          psVar5 = stbi__readval((stbi__context *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                 in_stack_ffffffffffffff64,(stbi_uc *)in_stack_ffffffffffffff58);
          if (psVar5 == (stbi_uc *)0x0) {
            return (stbi_uc *)0x0;
          }
          local_78 = local_78 + 4;
        }
      }
      else if (uVar4 == 1) {
        uVar6 = 1;
        for (local_80 = local_14; 0 < local_80; local_80 = local_80 - (uint)local_85) {
          local_85 = stbi__get8(in_stack_ffffffffffffff58);
          iVar3 = stbi__at_eof(in_stack_ffffffffffffff58);
          if (iVar3 != 0) {
            stbi__err((char *)CONCAT44(in_stack_ffffffffffffff64,uVar6));
            return (stbi_uc *)0x0;
          }
          if (local_80 < (int)(uint)local_85) {
            local_85 = (byte)local_80;
          }
          psVar5 = stbi__readval((stbi__context *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                 in_stack_ffffffffffffff64,(stbi_uc *)in_stack_ffffffffffffff58);
          if (psVar5 == (stbi_uc *)0x0) {
            return (stbi_uc *)0x0;
          }
          for (local_84 = 0; local_84 < (int)(uint)local_85; local_84 = local_84 + 1) {
            stbi__copyval((uint)local_70[2],local_78,local_89);
            local_78 = local_78 + 4;
          }
        }
      }
      else {
        if (uVar4 != 2) {
          stbi__err((char *)CONCAT44(in_stack_ffffffffffffff64,uVar4));
          return (stbi_uc *)0x0;
        }
        uVar6 = 2;
        for (local_90 = local_14; 0 < local_90; local_90 = local_90 - in_stack_ffffffffffffff6c) {
          bVar1 = stbi__get8(in_stack_ffffffffffffff58);
          uVar4 = (uint)bVar1;
          iVar3 = stbi__at_eof(in_stack_ffffffffffffff58);
          if (iVar3 != 0) {
            stbi__err((char *)CONCAT44(in_stack_ffffffffffffff64,uVar6));
            return (stbi_uc *)0x0;
          }
          if ((int)uVar4 < 0x80) {
            in_stack_ffffffffffffff6c = uVar4 + 1;
            if (local_90 < in_stack_ffffffffffffff6c) {
              stbi__err((char *)CONCAT44(in_stack_ffffffffffffff64,uVar6));
              return (stbi_uc *)0x0;
            }
            for (in_stack_ffffffffffffff68 = 0;
                in_stack_ffffffffffffff68 < in_stack_ffffffffffffff6c;
                in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 + 1) {
              psVar5 = stbi__readval((stbi__context *)
                                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                     in_stack_ffffffffffffff64,(stbi_uc *)in_stack_ffffffffffffff58)
              ;
              if (psVar5 == (stbi_uc *)0x0) {
                return (stbi_uc *)0x0;
              }
              local_78 = local_78 + 4;
            }
          }
          else {
            if (uVar4 == 0x80) {
              in_stack_ffffffffffffff6c =
                   stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,uVar6));
            }
            else {
              in_stack_ffffffffffffff6c = uVar4 - 0x7f;
            }
            if (local_90 < in_stack_ffffffffffffff6c) {
              stbi__err((char *)CONCAT44(in_stack_ffffffffffffff64,uVar6));
              return (stbi_uc *)0x0;
            }
            psVar5 = stbi__readval((stbi__context *)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                   in_stack_ffffffffffffff64,(stbi_uc *)in_stack_ffffffffffffff58);
            if (psVar5 == (stbi_uc *)0x0) {
              return (stbi_uc *)0x0;
            }
            for (in_stack_ffffffffffffff68 = 0;
                in_stack_ffffffffffffff68 < in_stack_ffffffffffffff6c;
                in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 + 1) {
              stbi__copyval((uint)local_70[2],local_78,&stack0xffffffffffffff64);
              local_78 = local_78 + 4;
            }
          }
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

static stbi_uc *stbi__pic_load_core(stbi__context *s,int width,int height,int *comp, stbi_uc *result)
{
   int act_comp=0,num_packets=0,y,chained;
   stbi__pic_packet packets[10];

   // this will (should...) cater for even some bizarre stuff like having data
    // for the same channel in multiple packets.
   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return stbi__errpuc("bad format","too many packets");

      packet = &packets[num_packets++];

      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);

      act_comp |= packet->channel;

      if (stbi__at_eof(s))          return stbi__errpuc("bad file","file too short (reading packets)");
      if (packet->size != 8)  return stbi__errpuc("bad format","packet isn't 8bpp");
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3); // has alpha channel?

   for(y=0; y<height; ++y) {
      int packet_idx;

      for(packet_idx=0; packet_idx < num_packets; ++packet_idx) {
         stbi__pic_packet *packet = &packets[packet_idx];
         stbi_uc *dest = result+y*width*4;

         switch (packet->type) {
            default:
               return stbi__errpuc("bad format","packet has bad compression type");

            case 0: {//uncompressed
               int x;

               for(x=0;x<width;++x, dest+=4)
                  if (!stbi__readval(s,packet->channel,dest))
                     return 0;
               break;
            }

            case 1://Pure RLE
               {
                  int left=width, i;

                  while (left>0) {
                     stbi_uc count,value[4];

                     count=stbi__get8(s);
                     if (stbi__at_eof(s))   return stbi__errpuc("bad file","file too short (pure read count)");

                     if (count > left)
                        count = (stbi_uc) left;

                     if (!stbi__readval(s,packet->channel,value))  return 0;

                     for(i=0; i<count; ++i,dest+=4)
                        stbi__copyval(packet->channel,dest,value);
                     left -= count;
                  }
               }
               break;

            case 2: {//Mixed RLE
               int left=width;
               while (left>0) {
                  int count = stbi__get8(s), i;
                  if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (mixed read count)");

                  if (count >= 128) { // Repeated
                     stbi_uc value[4];

                     if (count==128)
                        count = stbi__get16be(s);
                     else
                        count -= 127;
                     if (count > left)
                        return stbi__errpuc("bad file","scanline overrun");

                     if (!stbi__readval(s,packet->channel,value))
                        return 0;

                     for(i=0;i<count;++i, dest += 4)
                        stbi__copyval(packet->channel,dest,value);
                  } else { // Raw
                     ++count;
                     if (count>left) return stbi__errpuc("bad file","scanline overrun");

                     for(i=0;i<count;++i, dest+=4)
                        if (!stbi__readval(s,packet->channel,dest))
                           return 0;
                  }
                  left-=count;
               }
               break;
            }
         }
      }
   }

   return result;
}